

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

ctmbstr ExpandTilde(TidyDocImpl *doc,ctmbstr filename)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  passwd *ppVar4;
  ctmbstr ptVar5;
  size_t sVar6;
  
  if (filename == (ctmbstr)0x0) {
    filename = (tmbstr)0x0;
  }
  else if (*filename == '~') {
    ptVar5 = filename;
    if (filename[1] == '/') {
      pcVar3 = getenv("HOME");
      if (pcVar3 != (char *)0x0) {
        ptVar5 = filename + 1;
      }
    }
    else {
      for (sVar6 = 1; (filename[sVar6] != '\0' && (filename[sVar6] != '/')); sVar6 = sVar6 + 1) {
      }
      pcVar3 = (char *)(*doc->allocator->vtbl->alloc)(doc->allocator,sVar6);
      if (pcVar3 == (char *)0x0) {
        ppVar4 = (passwd *)0x0;
      }
      else {
        memcpy(pcVar3,filename + 1,sVar6 - 1);
        pcVar3[sVar6 - 1] = '\0';
        ppVar4 = getpwnam(pcVar3);
        (*doc->allocator->vtbl->free)(doc->allocator,pcVar3);
      }
      if (ppVar4 == (passwd *)0x0) {
        pcVar3 = (ctmbstr)0x0;
      }
      else {
        pcVar3 = ppVar4->pw_dir;
        ptVar5 = filename + sVar6;
      }
    }
    filename = ptVar5;
    if (pcVar3 != (ctmbstr)0x0) {
      uVar1 = prvTidytmbstrlen(ptVar5);
      uVar2 = prvTidytmbstrlen(pcVar3);
      filename = (ctmbstr)(*doc->allocator->vtbl->alloc)
                                    (doc->allocator,(long)uVar1 + (long)uVar2 + 1);
      prvTidytmbstrcpy(filename,pcVar3);
      prvTidytmbstrcat(filename,ptVar5);
    }
  }
  return filename;
}

Assistant:

static ctmbstr ExpandTilde( TidyDocImpl* doc, ctmbstr filename )
{
    char *home_dir = NULL;

    if ( !filename )
        return NULL;

    if ( filename[0] != '~' )
        return filename;

    if (filename[1] == '/')
    {
        home_dir = getenv("HOME");
        if (home_dir) {
            ++filename;
        }
#ifdef _WIN32
        else if (strlen(filename) >= 3) {   /* at least '~/+1' */
            /* no HOME env in Windows - got for HOMEDRIVE=C: HOMEPATH=\Users\user */
            char * hd = getenv("HOMEDRIVE");
            char * hp = getenv("HOMEPATH");
            if (hd && hp) {
                ctmbstr s = TidyDocAlloc(doc, _MAX_PATH);
                strcpy(s, hd);
                strcat(s, hp);
                strcat(s, "\\");
                strcat(s, &filename[2]);
                return s;
            }

        }
#endif /* _WIN32 */

    }
#ifdef SUPPORT_GETPWNAM
    else
    {
        struct passwd *passwd = NULL;
        ctmbstr s = filename + 1;
        tmbstr t;

        while ( *s && *s != '/' )
            s++;

        if ( (t = TidyDocAlloc(doc, s - filename)) )
        {
            memcpy(t, filename+1, s-filename-1);
            t[s-filename-1] = 0;

            passwd = getpwnam(t);

            TidyDocFree(doc, t);
        }

        if ( passwd )
        {
            filename = s;
            home_dir = passwd->pw_dir;
        }
    }
#endif /* SUPPORT_GETPWNAM */

    if ( home_dir )
    {
        uint len = TY_(tmbstrlen)(filename) + TY_(tmbstrlen)(home_dir) + 1;
        tmbstr p = (tmbstr)TidyDocAlloc( doc, len );
        TY_(tmbstrcpy)( p, home_dir );
        TY_(tmbstrcat)( p, filename );
        return (ctmbstr) p;
    }
    return (ctmbstr) filename;
}